

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O1

int secp256k1_ec_seckey_tweak_add_helper(secp256k1_scalar *sec,uchar *tweak32)

{
  bool bVar1;
  unsigned_long _zzq_result;
  int overflow;
  secp256k1_scalar term;
  unsigned_long _zzq_args [6];
  int local_60;
  secp256k1_scalar local_5c [13];
  
  local_60 = 0;
  secp256k1_scalar_set_b32(local_5c,tweak32,&local_60);
  bVar1 = local_60 == 0;
  secp256k1_scalar_add(sec,sec,local_5c);
  secp256k1_scalar_verify(sec);
  return (uint)(*sec != 0 && bVar1);
}

Assistant:

static int secp256k1_ec_seckey_tweak_add_helper(secp256k1_scalar *sec, const unsigned char *tweak32) {
    secp256k1_scalar term;
    int overflow = 0;
    int ret = 0;

    secp256k1_scalar_set_b32(&term, tweak32, &overflow);
    ret = (!overflow) & secp256k1_eckey_privkey_tweak_add(sec, &term);
    secp256k1_scalar_clear(&term);
    return ret;
}